

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTNode.cpp
# Opt level: O0

void __thiscall
phaeton::ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList>::
_delete(ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList> *this)

{
  int iVar1;
  const_reference ppDVar2;
  int local_14;
  int i;
  ASTNodeList<const_phaeton::Decl,_(phaeton::ASTNode::ASTNodeKind)1,_phaeton::DeclList> *this_local;
  
  local_14 = 0;
  while( true ) {
    iVar1 = size(this);
    if (iVar1 <= local_14) break;
    ppDVar2 = std::vector<const_phaeton::Decl_*,_std::allocator<const_phaeton::Decl_*>_>::operator[]
                        (&this->Elements,(long)local_14);
    Decl::_delete(*ppDVar2);
    ppDVar2 = std::vector<const_phaeton::Decl_*,_std::allocator<const_phaeton::Decl_*>_>::operator[]
                        (&this->Elements,(long)local_14);
    if (*ppDVar2 != (value_type)0x0) {
      (*((*ppDVar2)->super_ASTNode)._vptr_ASTNode[4])();
    }
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

void ASTNodeList<T, NK, Derived>::_delete() const {
  for (int i = 0; i < size(); i++) {
    Elements[i]->_delete();
    delete Elements[i];
  }
}